

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O2

void SetCycErrorNotifyMask(EC_T_DWORD dwInstanceID,EC_T_DWORD dwCycErrorNotifyMask)

{
  undefined4 in_EAX;
  EC_T_DWORD *pEStack_8;
  EC_T_DWORD dwCycErrorNotifyMask_local;
  
  pEStack_8 = (EC_T_DWORD *)CONCAT44(dwCycErrorNotifyMask,in_EAX);
  emIoCtl(dwInstanceID,8,&dwCycErrorNotifyMask_local,4,(void *)0x0,0,pEStack_8);
  return;
}

Assistant:

EC_T_VOID SetCycErrorNotifyMask
    (EC_T_DWORD          dwInstanceID
    ,EC_T_DWORD          dwCycErrorNotifyMask )
{
    emIoCtl(dwInstanceID, EC_IOCTL_SET_CYC_ERROR_NOTIFY_MASK, &dwCycErrorNotifyMask, sizeof(EC_T_DWORD), EC_NULL, 0, EC_NULL);
}